

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformedBilinearARGB32PM_fast_rotate_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int fdy)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uchar *puVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  undefined1 auVar85 [15];
  unkuint9 Var86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  unkuint9 Var89;
  undefined1 auVar90 [15];
  undefined1 auVar91 [12];
  undefined1 auVar92 [15];
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  undefined1 auVar95 [11];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  unkbyte10 Var102;
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  int iVar109;
  long lVar110;
  long lVar111;
  int iVar112;
  int iVar113;
  uint uVar114;
  ulong uVar115;
  uint uVar116;
  int iVar117;
  long lVar118;
  ulong uVar119;
  int iVar120;
  int iVar121;
  uint uVar122;
  long lVar123;
  int iVar124;
  int iVar125;
  long lVar126;
  uint *puVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [12];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar130 [12];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [12];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  uint uVar153;
  undefined1 auVar148 [12];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint uVar155;
  undefined1 auVar152 [16];
  short sVar156;
  short sVar161;
  short sVar162;
  undefined4 uVar157;
  short sVar163;
  short sVar164;
  short sVar165;
  short sVar166;
  short sVar167;
  short sVar168;
  short sVar169;
  undefined1 auVar158 [12];
  short sVar170;
  short sVar171;
  short sVar172;
  short sVar173;
  undefined1 auVar160 [16];
  short sVar174;
  short sVar175;
  undefined1 in_XMM14 [16];
  undefined1 auVar176 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar177 [16];
  undefined1 auVar133 [16];
  undefined1 auVar138 [16];
  undefined1 auVar151 [16];
  uint uVar154;
  undefined1 auVar159 [16];
  
  iVar121 = image->x1;
  iVar113 = image->x2;
  iVar117 = image->y1;
  iVar125 = image->y2;
  if (b < end) {
    puVar6 = image->imageData;
    lVar111 = image->bytesPerLine;
    uVar122 = *fy;
    do {
      iVar109 = *fx >> 0x10;
      iVar124 = (int)uVar122 >> 0x10;
      iVar112 = image->x2 + -1;
      iVar120 = iVar112;
      if (iVar109 < iVar112) {
        iVar112 = iVar109;
        iVar120 = iVar109 + 1;
      }
      iVar1 = image->x1;
      if (iVar109 < iVar1) {
        iVar120 = iVar1;
        iVar112 = iVar1;
      }
      iVar109 = image->y2 + -1;
      iVar1 = iVar109;
      if (iVar124 < iVar109) {
        iVar109 = iVar124;
        iVar1 = iVar124 + 1;
      }
      iVar2 = image->y1;
      if (iVar124 < iVar2) {
        iVar1 = iVar2;
        iVar109 = iVar2;
      }
      if ((iVar112 != iVar120) && (iVar109 != iVar1)) break;
      lVar110 = iVar109 * lVar111;
      lVar118 = iVar1 * lVar111;
      uVar114 = (uint)*fx >> 8 & 0xff;
      uVar157 = *(undefined4 *)(puVar6 + (long)iVar120 * 4 + lVar110);
      uVar3 = *(undefined4 *)(puVar6 + (long)iVar112 * 4 + lVar110);
      uVar119 = CONCAT44(uVar157,uVar3);
      uVar4 = *(undefined4 *)(puVar6 + (long)iVar120 * 4 + lVar118);
      uVar5 = *(undefined4 *)(puVar6 + (long)iVar112 * 4 + lVar118);
      uVar115 = CONCAT44(uVar4,uVar5);
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar119;
      auVar7[0xe] = (char)((uint)uVar157 >> 0x18);
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar119;
      auVar13[0xc] = (char)((uint)uVar157 >> 0x10);
      auVar13._13_2_ = auVar7._13_2_;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar119;
      auVar19._12_3_ = auVar13._12_3_;
      auVar25._8_2_ = 0;
      auVar25._0_8_ = uVar119;
      auVar25[10] = (char)((uint)uVar157 >> 8);
      auVar25._11_4_ = auVar19._11_4_;
      auVar31._8_2_ = 0;
      auVar31._0_8_ = uVar119;
      auVar31._10_5_ = auVar25._10_5_;
      auVar37[8] = (char)uVar157;
      auVar37._0_8_ = uVar119;
      auVar37._9_6_ = auVar31._9_6_;
      auVar85._7_8_ = 0;
      auVar85._0_7_ = auVar37._8_7_;
      Var86 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)((uint)uVar3 >> 0x18));
      auVar100._9_6_ = 0;
      auVar100._0_9_ = Var86;
      auVar43[4] = (char)((uint)uVar3 >> 0x10);
      auVar43._0_4_ = uVar3;
      auVar43._5_10_ = SUB1510(auVar100 << 0x30,5);
      auVar87._11_4_ = 0;
      auVar87._0_11_ = auVar43._4_11_;
      auVar47[2] = (char)((uint)uVar3 >> 8);
      auVar47._0_2_ = (ushort)uVar3;
      auVar47._3_12_ = SUB1512(auVar87 << 0x20,3);
      auVar8._8_6_ = 0;
      auVar8._0_8_ = uVar115;
      auVar8[0xe] = (char)((uint)uVar4 >> 0x18);
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar115;
      auVar14[0xc] = (char)((uint)uVar4 >> 0x10);
      auVar14._13_2_ = auVar8._13_2_;
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar115;
      auVar20._12_3_ = auVar14._12_3_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = uVar115;
      auVar26[10] = (char)((uint)uVar4 >> 8);
      auVar26._11_4_ = auVar20._11_4_;
      auVar32._8_2_ = 0;
      auVar32._0_8_ = uVar115;
      auVar32._10_5_ = auVar26._10_5_;
      auVar38[8] = (char)uVar4;
      auVar38._0_8_ = uVar115;
      auVar38._9_6_ = auVar32._9_6_;
      auVar88._7_8_ = 0;
      auVar88._0_7_ = auVar38._8_7_;
      Var89 = CONCAT81(SUB158(auVar88 << 0x40,7),(char)((uint)uVar5 >> 0x18));
      auVar101._9_6_ = 0;
      auVar101._0_9_ = Var89;
      auVar44[4] = (char)((uint)uVar5 >> 0x10);
      auVar44._0_4_ = uVar5;
      auVar44._5_10_ = SUB1510(auVar101 << 0x30,5);
      auVar90._11_4_ = 0;
      auVar90._0_11_ = auVar44._4_11_;
      auVar48[2] = (char)((uint)uVar5 >> 8);
      auVar48._0_2_ = (ushort)uVar5;
      auVar48._3_12_ = SUB1512(auVar90 << 0x20,3);
      uVar122 = uVar122 >> 8 & 0xff;
      auVar131 = pshuflw(ZEXT416(0x100 - uVar122),ZEXT416(0x100 - uVar122),0);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      auVar131 = pshuflw(ZEXT416(uVar122),ZEXT416(uVar122),0);
      sVar161 = auVar131._0_2_;
      sVar162 = auVar131._2_2_;
      auVar150._0_4_ =
           CONCAT22(sVar162 * auVar48._2_2_ + sVar156 * auVar47._2_2_,
                    sVar161 * ((ushort)uVar5 & 0xff) + sVar165 * ((ushort)uVar3 & 0xff));
      auVar142._0_8_ =
           CONCAT26(sVar162 * (short)Var89 + sVar156 * (short)Var86,
                    CONCAT24(sVar161 * auVar44._4_2_ + sVar165 * auVar43._4_2_,auVar150._0_4_));
      auVar142._8_2_ = sVar161 * auVar38._8_2_ + sVar165 * auVar37._8_2_;
      auVar142._10_2_ = sVar162 * auVar26._10_2_ + sVar156 * auVar25._10_2_;
      auVar143._12_2_ = sVar161 * auVar14._12_2_ + sVar165 * auVar13._12_2_;
      auVar143._0_12_ = auVar142;
      auVar143._14_2_ = sVar162 * (auVar8._13_2_ >> 8) + sVar156 * (auVar7._13_2_ >> 8);
      auVar131._0_4_ = CONCAT22((short)uVar114,(short)(0x100 - uVar114));
      auVar131._4_4_ = auVar131._0_4_;
      auVar131._8_4_ = auVar131._0_4_;
      auVar131._12_4_ = auVar131._0_4_;
      auVar150._12_4_ = auVar143._12_4_;
      auVar150._4_4_ = auVar142._8_4_;
      auVar150._8_4_ = (int)((ulong)auVar142._0_8_ >> 0x20);
      auVar143 = pshuflw(auVar150,auVar150,0xd8);
      auVar143 = pshufhw(auVar143,auVar143,0xd8);
      auVar144._0_2_ = auVar143._0_2_ >> 8;
      auVar144._2_2_ = auVar143._2_2_ >> 8;
      auVar144._4_2_ = auVar143._4_2_ >> 8;
      auVar144._6_2_ = auVar143._6_2_ >> 8;
      auVar144._8_2_ = auVar143._8_2_ >> 8;
      auVar144._10_2_ = auVar143._10_2_ >> 8;
      auVar144._12_2_ = auVar143._12_2_ >> 8;
      auVar144._14_2_ = auVar143._14_2_ >> 8;
      auVar131 = pmaddwd(auVar144,auVar131);
      auVar145._0_4_ = auVar131._0_4_ >> 8;
      auVar145._4_4_ = auVar131._4_4_ >> 8;
      auVar145._8_4_ = auVar131._8_4_ >> 8;
      auVar145._12_4_ = auVar131._12_4_ >> 8;
      auVar131 = packssdw(auVar145,auVar145);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      sVar161 = auVar131._4_2_;
      sVar162 = auVar131._6_2_;
      *b = CONCAT13((0 < sVar162) * (sVar162 < 0x100) * auVar131[6] - (0xff < sVar162),
                    CONCAT12((0 < sVar161) * (sVar161 < 0x100) * auVar131[4] - (0xff < sVar161),
                             CONCAT11((0 < sVar156) * (sVar156 < 0x100) * auVar131[2] -
                                      (0xff < sVar156),
                                      (0 < sVar165) * (sVar165 < 0x100) * auVar131[0] -
                                      (0xff < sVar165))));
      *fx = *fx + fdx;
      uVar122 = *fy + fdy;
      *fy = uVar122;
      b = b + 1;
    } while (b < end);
  }
  if (fdx < 1) {
    puVar127 = end;
    if ((fdx < 0) &&
       (puVar127 = b + ((long)iVar121 * 0x10000 - (long)*fx) / (long)fdx,
       end < b + ((long)iVar121 * 0x10000 - (long)*fx) / (long)fdx)) {
      puVar127 = end;
    }
  }
  else {
    puVar127 = b + (((long)iVar113 * 0x10000 + -0x10000) - (long)*fx) / (long)(ulong)(uint)fdx;
    if (end < b + (((long)iVar113 * 0x10000 + -0x10000) - (long)*fx) / (long)(ulong)(uint)fdx) {
      puVar127 = end;
    }
  }
  uVar119 = (ulong)(uint)fdy;
  if (fdy < 1) {
    iVar121 = *fy;
    if (-1 < fdy) goto LAB_0065b661;
    lVar111 = (long)iVar117 * 0x10000 - (long)iVar121;
    uVar119 = (ulong)fdy;
  }
  else {
    iVar121 = *fy;
    lVar111 = ((long)iVar125 * 0x10000 + -0x10000) - (long)iVar121;
  }
  if (b + lVar111 / (long)uVar119 <= puVar127) {
    puVar127 = b + lVar111 / (long)uVar119;
  }
LAB_0065b661:
  iVar113 = *fx + fdx;
  iVar117 = iVar113 + fdx;
  auVar128._12_4_ = iVar117 + fdx;
  auVar128._8_4_ = iVar117;
  auVar128._4_4_ = iVar113;
  auVar128._0_4_ = *fx;
  iVar113 = iVar121 + fdy + fdy;
  auVar132._12_4_ = iVar113 + fdy;
  auVar132._8_4_ = iVar113;
  auVar132._4_4_ = iVar121 + fdy;
  auVar132._0_4_ = iVar121;
  uVar119 = image->bytesPerLine;
  uVar115 = uVar119 + 3;
  if (-1 < (long)uVar119) {
    uVar115 = uVar119;
  }
  if (b < puVar127 + -3) {
    puVar6 = image->imageData;
    auVar131 = ZEXT416((uint)(uVar115 >> 2));
    auVar131 = pshuflw(auVar131,auVar131,0);
    do {
      auVar149._0_4_ = auVar132._0_4_ >> 0x10;
      uVar122 = auVar132._4_4_;
      auVar149._4_4_ = uVar122 >> 0x10;
      uVar116 = auVar132._8_4_;
      uVar154 = auVar132._12_4_;
      auVar149._8_4_ = uVar116 >> 0x10;
      auVar149._12_4_ = uVar154 >> 0x10;
      auVar143 = packssdw(auVar149,_DAT_00675910);
      sVar165 = auVar143._6_2_ * auVar131._6_2_;
      auVar150 = pmulhw(auVar143,auVar131);
      iVar121 = CONCAT22(auVar150._6_2_,sVar165);
      Var102 = CONCAT64(CONCAT42(iVar121,auVar150._4_2_),
                        CONCAT22(auVar143._4_2_ * auVar131._4_2_,sVar165));
      auVar91._4_8_ = (long)((unkuint10)Var102 >> 0x10);
      auVar91._2_2_ = auVar150._2_2_;
      auVar91._0_2_ = auVar143._2_2_ * auVar131._2_2_;
      uVar114 = auVar128._4_4_;
      uVar153 = auVar128._8_4_;
      uVar155 = auVar128._12_4_;
      lVar110 = (long)(int)((auVar128._0_4_ >> 0x10) +
                           CONCAT22(auVar150._0_2_,auVar143._0_2_ * auVar131._0_2_));
      lVar118 = (long)(int)((uVar114 >> 0x10) + auVar91._0_4_);
      lVar126 = (long)(int)((uVar153 >> 0x10) + (int)((unkuint10)Var102 >> 0x10));
      lVar123 = (long)(int)((uVar155 >> 0x10) + iVar121);
      uVar67 = *(ushort *)(puVar6 + lVar123 * 4 + 0xc);
      uVar68 = *(ushort *)(puVar6 + lVar123 * 4 + 0xe);
      uVar65 = *(ushort *)(puVar6 + lVar126 * 4 + 8);
      uVar66 = *(ushort *)(puVar6 + lVar126 * 4 + 10);
      uVar61 = *(ushort *)(puVar6 + lVar110 * 4);
      uVar62 = *(ushort *)((long)(puVar6 + lVar110 * 4) + 2);
      uVar63 = *(ushort *)(puVar6 + lVar118 * 4 + 4);
      uVar64 = *(ushort *)(puVar6 + lVar118 * 4 + 6);
      uVar83 = *(ushort *)(puVar6 + lVar123 * 4 + 0x10);
      uVar84 = *(ushort *)(puVar6 + lVar123 * 4 + 0x12);
      uVar81 = *(ushort *)(puVar6 + lVar126 * 4 + 0xc);
      uVar82 = *(ushort *)(puVar6 + lVar126 * 4 + 0xe);
      uVar77 = *(ushort *)(puVar6 + lVar110 * 4 + 4);
      uVar78 = *(ushort *)((long)(puVar6 + lVar110 * 4 + 4) + 2);
      uVar79 = *(ushort *)(puVar6 + lVar118 * 4 + 8);
      uVar80 = *(ushort *)(puVar6 + lVar118 * 4 + 10);
      lVar111 = lVar123 * 4 + uVar119;
      uVar59 = *(ushort *)(puVar6 + lVar111 + 0xc);
      uVar60 = *(ushort *)(puVar6 + lVar111 + 0xe);
      lVar111 = lVar126 * 4 + uVar119;
      uVar57 = *(ushort *)(puVar6 + lVar111 + 8);
      uVar58 = *(ushort *)(puVar6 + lVar111 + 10);
      uVar53 = *(ushort *)(puVar6 + lVar110 * 4 + uVar119);
      uVar54 = *(ushort *)((long)(puVar6 + lVar110 * 4 + uVar119) + 2);
      lVar111 = lVar118 * 4 + uVar119;
      uVar55 = *(ushort *)(puVar6 + lVar111 + 4);
      uVar56 = *(ushort *)(puVar6 + lVar111 + 6);
      lVar111 = lVar123 * 4 + uVar119 + 4;
      uVar75 = *(ushort *)(puVar6 + lVar111 + 0xc);
      uVar76 = *(ushort *)(puVar6 + lVar111 + 0xe);
      lVar111 = lVar126 * 4 + uVar119 + 4;
      uVar73 = *(ushort *)(puVar6 + lVar111 + 8);
      uVar74 = *(ushort *)(puVar6 + lVar111 + 10);
      uVar69 = *(ushort *)(puVar6 + lVar110 * 4 + uVar119 + 4);
      uVar70 = *(ushort *)((long)(puVar6 + lVar110 * 4 + uVar119 + 4) + 2);
      lVar111 = lVar118 * 4 + uVar119 + 4;
      uVar71 = *(ushort *)(puVar6 + lVar111 + 4);
      uVar72 = *(ushort *)(puVar6 + lVar111 + 6);
      iVar121 = CONCAT22(auVar128._2_2_ >> 8,auVar128._0_2_ >> 8);
      auVar148._0_8_ = CONCAT26(auVar128._6_2_ >> 8,CONCAT24(auVar128._4_2_ >> 8,iVar121));
      auVar148._8_2_ = auVar128._8_2_ >> 8;
      auVar148._10_2_ = auVar128._10_2_ >> 8;
      auVar151._12_2_ = auVar128._12_2_ >> 8;
      auVar151._0_12_ = auVar148;
      auVar151._14_2_ = auVar128._14_2_ >> 8;
      iVar113 = CONCAT22(auVar132._2_2_ >> 8,auVar132._0_2_ >> 8);
      auVar158._0_8_ = CONCAT26(auVar132._6_2_ >> 8,CONCAT24(auVar132._4_2_ >> 8,iVar113));
      auVar158._8_2_ = auVar132._8_2_ >> 8;
      auVar158._10_2_ = auVar132._10_2_ >> 8;
      auVar159._12_2_ = auVar132._12_2_ >> 8;
      auVar159._0_12_ = auVar158;
      auVar159._14_2_ = auVar132._14_2_ >> 8;
      auVar152._0_4_ = iVar121 + 8;
      auVar152._4_4_ = (int)((ulong)auVar148._0_8_ >> 0x20) + 8;
      auVar152._8_4_ = auVar148._8_4_ + 8;
      auVar152._12_4_ = auVar151._12_4_ + 8;
      auVar160._0_4_ = iVar113 + 8;
      auVar160._4_4_ = (int)((ulong)auVar158._0_8_ >> 0x20) + 8;
      auVar160._8_4_ = auVar158._8_4_ + 8;
      auVar160._12_4_ = auVar159._12_4_ + 8;
      auVar143 = pshuflw(auVar152,auVar152,0xa0);
      auVar150 = pshufhw(in_XMM15,auVar143,0xa0);
      auVar177._0_2_ = auVar150._0_2_ >> 4;
      auVar177._2_2_ = auVar150._2_2_ >> 4;
      auVar177._4_2_ = auVar150._4_2_ >> 4;
      auVar177._6_2_ = auVar150._6_2_ >> 4;
      auVar177._8_2_ = auVar150._8_2_ >> 4;
      auVar177._10_2_ = auVar150._10_2_ >> 4;
      auVar177._12_2_ = auVar150._12_2_ >> 4;
      auVar177._14_2_ = auVar150._14_2_ >> 4;
      auVar143 = pshuflw(auVar143,auVar160,0xa0);
      auVar143 = pshufhw(in_XMM14,auVar143,0xa0);
      auVar176._0_2_ = auVar143._0_2_ >> 4;
      auVar176._2_2_ = auVar143._2_2_ >> 4;
      auVar176._4_2_ = auVar143._4_2_ >> 4;
      auVar176._6_2_ = auVar143._6_2_ >> 4;
      auVar176._8_2_ = auVar143._8_2_ >> 4;
      auVar176._10_2_ = auVar143._10_2_ >> 4;
      auVar176._12_2_ = auVar143._12_2_ >> 4;
      auVar176._14_2_ = auVar143._14_2_ >> 4;
      sVar165 = auVar177._0_2_ * auVar176._0_2_;
      sVar161 = auVar177._2_2_ * auVar176._2_2_;
      sVar163 = auVar177._4_2_ * auVar176._4_2_;
      sVar166 = auVar177._6_2_ * auVar176._6_2_;
      sVar168 = auVar177._8_2_ * auVar176._8_2_;
      sVar170 = auVar177._10_2_ * auVar176._10_2_;
      sVar172 = auVar177._12_2_ * auVar176._12_2_;
      sVar174 = auVar177._14_2_ * auVar176._14_2_;
      auVar150 = psllw(auVar177,4);
      auVar143 = psllw(auVar176,4);
      in_XMM15._0_2_ = auVar150._0_2_ - sVar165;
      in_XMM15._2_2_ = auVar150._2_2_ - sVar161;
      in_XMM15._4_2_ = auVar150._4_2_ - sVar163;
      in_XMM15._6_2_ = auVar150._6_2_ - sVar166;
      in_XMM15._8_2_ = auVar150._8_2_ - sVar168;
      in_XMM15._10_2_ = auVar150._10_2_ - sVar170;
      in_XMM15._12_2_ = auVar150._12_2_ - sVar172;
      in_XMM15._14_2_ = auVar150._14_2_ - sVar174;
      in_XMM14._0_2_ = auVar143._0_2_ - sVar165;
      in_XMM14._2_2_ = auVar143._2_2_ - sVar161;
      in_XMM14._4_2_ = auVar143._4_2_ - sVar163;
      in_XMM14._6_2_ = auVar143._6_2_ - sVar166;
      in_XMM14._8_2_ = auVar143._8_2_ - sVar168;
      in_XMM14._10_2_ = auVar143._10_2_ - sVar170;
      in_XMM14._12_2_ = auVar143._12_2_ - sVar172;
      in_XMM14._14_2_ = auVar143._14_2_ - sVar174;
      sVar156 = (sVar165 - (auVar143._0_2_ + auVar150._0_2_)) + 0x100;
      sVar162 = (sVar161 - (auVar143._2_2_ + auVar150._2_2_)) + 0x100;
      sVar164 = (sVar163 - (auVar143._4_2_ + auVar150._4_2_)) + 0x100;
      sVar167 = (sVar166 - (auVar143._6_2_ + auVar150._6_2_)) + 0x100;
      sVar169 = (sVar168 - (auVar143._8_2_ + auVar150._8_2_)) + 0x100;
      sVar171 = (sVar170 - (auVar143._10_2_ + auVar150._10_2_)) + 0x100;
      sVar173 = (sVar172 - (auVar143._12_2_ + auVar150._12_2_)) + 0x100;
      sVar175 = (sVar174 - (auVar143._14_2_ + auVar150._14_2_)) + 0x100;
      *(ushort *)b = (ushort)((uVar69 & 0xff) * sVar165 + (uVar53 & 0xff) * in_XMM14._0_2_ +
                             (uVar77 & 0xff) * in_XMM15._0_2_ + (uVar61 & 0xff) * sVar156) >> 8 |
                     (uVar69 >> 8) * sVar165 + (uVar53 >> 8) * in_XMM14._0_2_ +
                     (uVar77 >> 8) * in_XMM15._0_2_ + (uVar61 >> 8) * sVar156 & 0xff00;
      *(ushort *)((long)b + 2) =
           (ushort)((uVar70 & 0xff) * sVar161 + (uVar54 & 0xff) * in_XMM14._2_2_ +
                   (uVar78 & 0xff) * in_XMM15._2_2_ + (uVar62 & 0xff) * sVar162) >> 8 |
           (uVar70 >> 8) * sVar161 + (uVar54 >> 8) * in_XMM14._2_2_ +
           (uVar78 >> 8) * in_XMM15._2_2_ + (uVar62 >> 8) * sVar162 & 0xff00;
      *(ushort *)(b + 1) =
           (ushort)((uVar71 & 0xff) * sVar163 + (uVar55 & 0xff) * in_XMM14._4_2_ +
                   (uVar79 & 0xff) * in_XMM15._4_2_ + (uVar63 & 0xff) * sVar164) >> 8 |
           (uVar71 >> 8) * sVar163 + (uVar55 >> 8) * in_XMM14._4_2_ +
           (uVar79 >> 8) * in_XMM15._4_2_ + (uVar63 >> 8) * sVar164 & 0xff00;
      *(ushort *)((long)b + 6) =
           (ushort)((uVar72 & 0xff) * sVar166 + (uVar56 & 0xff) * in_XMM14._6_2_ +
                   (uVar80 & 0xff) * in_XMM15._6_2_ + (uVar64 & 0xff) * sVar167) >> 8 |
           (uVar72 >> 8) * sVar166 + (uVar56 >> 8) * in_XMM14._6_2_ +
           (uVar80 >> 8) * in_XMM15._6_2_ + (uVar64 >> 8) * sVar167 & 0xff00;
      *(ushort *)(b + 2) =
           (ushort)((uVar73 & 0xff) * sVar168 + (uVar57 & 0xff) * in_XMM14._8_2_ +
                   (uVar81 & 0xff) * in_XMM15._8_2_ + (uVar65 & 0xff) * sVar169) >> 8 |
           (uVar73 >> 8) * sVar168 + (uVar57 >> 8) * in_XMM14._8_2_ +
           (uVar81 >> 8) * in_XMM15._8_2_ + (uVar65 >> 8) * sVar169 & 0xff00;
      *(ushort *)((long)b + 10) =
           (ushort)((uVar74 & 0xff) * sVar170 + (uVar58 & 0xff) * in_XMM14._10_2_ +
                   (uVar82 & 0xff) * in_XMM15._10_2_ + (uVar66 & 0xff) * sVar171) >> 8 |
           (uVar74 >> 8) * sVar170 + (uVar58 >> 8) * in_XMM14._10_2_ +
           (uVar82 >> 8) * in_XMM15._10_2_ + (uVar66 >> 8) * sVar171 & 0xff00;
      *(ushort *)(b + 3) =
           (ushort)((uVar75 & 0xff) * sVar172 + (uVar59 & 0xff) * in_XMM14._12_2_ +
                   (uVar83 & 0xff) * in_XMM15._12_2_ + (uVar67 & 0xff) * sVar173) >> 8 |
           (uVar75 >> 8) * sVar172 + (uVar59 >> 8) * in_XMM14._12_2_ +
           (uVar83 >> 8) * in_XMM15._12_2_ + (uVar67 >> 8) * sVar173 & 0xff00;
      *(ushort *)((long)b + 0xe) =
           (ushort)((uVar76 & 0xff) * sVar174 + (uVar60 & 0xff) * in_XMM14._14_2_ +
                   (uVar84 & 0xff) * in_XMM15._14_2_ + (uVar68 & 0xff) * sVar175) >> 8 |
           (uVar76 >> 8) * sVar174 + (uVar60 >> 8) * in_XMM14._14_2_ +
           (uVar84 >> 8) * in_XMM15._14_2_ + (uVar68 >> 8) * sVar175 & 0xff00;
      b = b + 4;
      auVar128._0_4_ = auVar128._0_4_ + fdx * 4;
      auVar128._4_4_ = uVar114 + fdx * 4;
      auVar128._8_4_ = uVar153 + fdx * 4;
      auVar128._12_4_ = uVar155 + fdx * 4;
      auVar132._0_4_ = auVar132._0_4_ + fdy * 4;
      auVar132._4_4_ = uVar122 + fdy * 4;
      auVar132._8_4_ = uVar116 + fdy * 4;
      auVar132._12_4_ = uVar154 + fdy * 4;
    } while (b < puVar127 + -3);
  }
  *fx = auVar128._0_4_;
  uVar122 = auVar132._0_4_;
  *fy = uVar122;
  if (b < puVar127) {
    puVar6 = image->imageData;
    lVar111 = image->bytesPerLine;
    do {
      uVar114 = (uint)*fx >> 8 & 0xff;
      lVar110 = (long)(*fx >> 0x10);
      uVar119 = *(ulong *)(puVar6 + lVar110 * 4 + lVar111 * ((int)uVar122 >> 0x10));
      uVar115 = *(ulong *)(puVar6 + lVar110 * 4 + (((int)uVar122 >> 0x10) + 1) * lVar111);
      auVar9._8_6_ = 0;
      auVar9._0_8_ = uVar119;
      auVar9[0xe] = (char)(uVar119 >> 0x38);
      auVar15._8_4_ = 0;
      auVar15._0_8_ = uVar119;
      auVar15[0xc] = (char)(uVar119 >> 0x30);
      auVar15._13_2_ = auVar9._13_2_;
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar119;
      auVar21._12_3_ = auVar15._12_3_;
      auVar27._8_2_ = 0;
      auVar27._0_8_ = uVar119;
      auVar27[10] = (char)(uVar119 >> 0x28);
      auVar27._11_4_ = auVar21._11_4_;
      auVar33._8_2_ = 0;
      auVar33._0_8_ = uVar119;
      auVar33._10_5_ = auVar27._10_5_;
      auVar39[8] = (char)(uVar119 >> 0x20);
      auVar39._0_8_ = uVar119;
      auVar39._9_6_ = auVar33._9_6_;
      auVar92._7_8_ = 0;
      auVar92._0_7_ = auVar39._8_7_;
      Var86 = CONCAT81(SUB158(auVar92 << 0x40,7),(char)(uVar119 >> 0x18));
      auVar103._9_6_ = 0;
      auVar103._0_9_ = Var86;
      auVar93._1_10_ = SUB1510(auVar103 << 0x30,5);
      auVar93[0] = (char)(uVar119 >> 0x10);
      auVar104._11_4_ = 0;
      auVar104._0_11_ = auVar93;
      auVar49[2] = (char)(uVar119 >> 8);
      auVar49._0_2_ = (ushort)uVar119;
      auVar49._3_12_ = SUB1512(auVar104 << 0x20,3);
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar115;
      auVar10[0xe] = (char)(uVar115 >> 0x38);
      auVar16._8_4_ = 0;
      auVar16._0_8_ = uVar115;
      auVar16[0xc] = (char)(uVar115 >> 0x30);
      auVar16._13_2_ = auVar10._13_2_;
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar115;
      auVar22._12_3_ = auVar16._12_3_;
      auVar28._8_2_ = 0;
      auVar28._0_8_ = uVar115;
      auVar28[10] = (char)(uVar115 >> 0x28);
      auVar28._11_4_ = auVar22._11_4_;
      auVar34._8_2_ = 0;
      auVar34._0_8_ = uVar115;
      auVar34._10_5_ = auVar28._10_5_;
      auVar40[8] = (char)(uVar115 >> 0x20);
      auVar40._0_8_ = uVar115;
      auVar40._9_6_ = auVar34._9_6_;
      auVar94._7_8_ = 0;
      auVar94._0_7_ = auVar40._8_7_;
      Var89 = CONCAT81(SUB158(auVar94 << 0x40,7),(char)(uVar115 >> 0x18));
      auVar105._9_6_ = 0;
      auVar105._0_9_ = Var89;
      auVar95._1_10_ = SUB1510(auVar105 << 0x30,5);
      auVar95[0] = (char)(uVar115 >> 0x10);
      auVar106._11_4_ = 0;
      auVar106._0_11_ = auVar95;
      auVar50[2] = (char)(uVar115 >> 8);
      auVar50._0_2_ = (ushort)uVar115;
      auVar50._3_12_ = SUB1512(auVar106 << 0x20,3);
      uVar122 = uVar122 >> 8 & 0xff;
      auVar131 = pshuflw(ZEXT416(0x100 - uVar122),ZEXT416(0x100 - uVar122),0);
      sVar161 = auVar131._0_2_;
      sVar162 = auVar131._2_2_;
      auVar131 = pshuflw(ZEXT416(uVar122),ZEXT416(uVar122),0);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      auVar134._0_4_ =
           CONCAT22(sVar156 * auVar50._2_2_ + sVar162 * auVar49._2_2_,
                    sVar165 * ((ushort)uVar115 & 0xff) + sVar161 * ((ushort)uVar119 & 0xff));
      auVar129._0_8_ =
           CONCAT26(sVar156 * (short)Var89 + sVar162 * (short)Var86,
                    CONCAT24(sVar165 * auVar95._0_2_ + sVar161 * auVar93._0_2_,auVar134._0_4_));
      auVar129._8_2_ = sVar165 * auVar40._8_2_ + sVar161 * auVar39._8_2_;
      auVar129._10_2_ = sVar156 * auVar28._10_2_ + sVar162 * auVar27._10_2_;
      auVar133._12_2_ = sVar165 * auVar16._12_2_ + sVar161 * auVar15._12_2_;
      auVar133._0_12_ = auVar129;
      auVar133._14_2_ = sVar156 * (auVar10._13_2_ >> 8) + sVar162 * (auVar9._13_2_ >> 8);
      auVar146._0_4_ = CONCAT22((short)uVar114,(short)(0x100 - uVar114));
      auVar146._4_4_ = auVar146._0_4_;
      auVar146._8_4_ = auVar146._0_4_;
      auVar146._12_4_ = auVar146._0_4_;
      auVar134._12_4_ = auVar133._12_4_;
      auVar134._4_4_ = auVar129._8_4_;
      auVar134._8_4_ = (int)((ulong)auVar129._0_8_ >> 0x20);
      auVar131 = pshuflw(auVar134,auVar134,0xd8);
      auVar131 = pshufhw(auVar131,auVar131,0xd8);
      auVar135._0_2_ = auVar131._0_2_ >> 8;
      auVar135._2_2_ = auVar131._2_2_ >> 8;
      auVar135._4_2_ = auVar131._4_2_ >> 8;
      auVar135._6_2_ = auVar131._6_2_ >> 8;
      auVar135._8_2_ = auVar131._8_2_ >> 8;
      auVar135._10_2_ = auVar131._10_2_ >> 8;
      auVar135._12_2_ = auVar131._12_2_ >> 8;
      auVar135._14_2_ = auVar131._14_2_ >> 8;
      auVar131 = pmaddwd(auVar135,auVar146);
      auVar136._0_4_ = auVar131._0_4_ >> 8;
      auVar136._4_4_ = auVar131._4_4_ >> 8;
      auVar136._8_4_ = auVar131._8_4_ >> 8;
      auVar136._12_4_ = auVar131._12_4_ >> 8;
      auVar131 = packssdw(auVar136,auVar136);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      sVar161 = auVar131._4_2_;
      sVar162 = auVar131._6_2_;
      *b = CONCAT13((0 < sVar162) * (sVar162 < 0x100) * auVar131[6] - (0xff < sVar162),
                    CONCAT12((0 < sVar161) * (sVar161 < 0x100) * auVar131[4] - (0xff < sVar161),
                             CONCAT11((0 < sVar156) * (sVar156 < 0x100) * auVar131[2] -
                                      (0xff < sVar156),
                                      (0 < sVar165) * (sVar165 < 0x100) * auVar131[0] -
                                      (0xff < sVar165))));
      *fx = *fx + fdx;
      uVar122 = *fy + fdy;
      *fy = uVar122;
      b = b + 1;
    } while (b < puVar127);
  }
  if (b < end) {
    puVar6 = image->imageData;
    lVar111 = image->bytesPerLine;
    do {
      iVar117 = *fx >> 0x10;
      iVar125 = (int)uVar122 >> 0x10;
      iVar121 = image->x2 + -1;
      iVar113 = iVar121;
      if (iVar117 < iVar121) {
        iVar121 = iVar117;
        iVar113 = iVar117 + 1;
      }
      iVar112 = image->x1;
      if (iVar117 < iVar112) {
        iVar113 = iVar112;
        iVar121 = iVar112;
      }
      iVar117 = image->y2 + -1;
      iVar112 = iVar117;
      if (iVar125 < iVar117) {
        iVar117 = iVar125;
        iVar112 = iVar125 + 1;
      }
      iVar120 = image->y1;
      if (iVar125 < iVar120) {
        iVar112 = iVar120;
        iVar117 = iVar120;
      }
      lVar110 = iVar117 * lVar111;
      uVar114 = *(uint *)(puVar6 + (long)iVar113 * 4 + lVar110);
      uVar157 = *(undefined4 *)(puVar6 + (long)iVar121 * 4 + lVar110);
      lVar110 = iVar112 * lVar111;
      uVar3 = *(undefined4 *)(puVar6 + (long)iVar113 * 4 + lVar110);
      uVar4 = *(undefined4 *)(puVar6 + (long)iVar121 * 4 + lVar110);
      uVar122 = uVar122 >> 8 & 0xff;
      uVar116 = (uint)*fx >> 8 & 0xff;
      uVar119 = CONCAT44(uVar114,uVar157);
      uVar115 = CONCAT44(uVar3,uVar4);
      auVar11._8_6_ = 0;
      auVar11._0_8_ = uVar119;
      auVar11[0xe] = (char)(uVar114 >> 0x18);
      auVar17._8_4_ = 0;
      auVar17._0_8_ = uVar119;
      auVar17[0xc] = (char)(uVar114 >> 0x10);
      auVar17._13_2_ = auVar11._13_2_;
      auVar23._8_4_ = 0;
      auVar23._0_8_ = uVar119;
      auVar23._12_3_ = auVar17._12_3_;
      auVar29._8_2_ = 0;
      auVar29._0_8_ = uVar119;
      auVar29[10] = (char)(uVar114 >> 8);
      auVar29._11_4_ = auVar23._11_4_;
      auVar35._8_2_ = 0;
      auVar35._0_8_ = uVar119;
      auVar35._10_5_ = auVar29._10_5_;
      auVar41[8] = (char)uVar114;
      auVar41._0_8_ = uVar119;
      auVar41._9_6_ = auVar35._9_6_;
      auVar96._7_8_ = 0;
      auVar96._0_7_ = auVar41._8_7_;
      Var86 = CONCAT81(SUB158(auVar96 << 0x40,7),(char)((uint)uVar157 >> 0x18));
      auVar107._9_6_ = 0;
      auVar107._0_9_ = Var86;
      auVar45[4] = (char)((uint)uVar157 >> 0x10);
      auVar45._0_4_ = uVar157;
      auVar45._5_10_ = SUB1510(auVar107 << 0x30,5);
      auVar97._11_4_ = 0;
      auVar97._0_11_ = auVar45._4_11_;
      auVar51[2] = (char)((uint)uVar157 >> 8);
      auVar51._0_2_ = (ushort)uVar157;
      auVar51._3_12_ = SUB1512(auVar97 << 0x20,3);
      auVar137._0_2_ = (ushort)uVar157 & 0xff;
      auVar137._2_13_ = auVar51._2_13_;
      auVar137[0xf] = 0;
      auVar131 = pshuflw(ZEXT416(uVar114),ZEXT416(0x100 - uVar122),0);
      sVar161 = auVar131._0_2_;
      sVar162 = auVar131._2_2_;
      auVar12._8_6_ = 0;
      auVar12._0_8_ = uVar115;
      auVar12[0xe] = (char)((uint)uVar3 >> 0x18);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar115;
      auVar18[0xc] = (char)((uint)uVar3 >> 0x10);
      auVar18._13_2_ = auVar12._13_2_;
      auVar24._8_4_ = 0;
      auVar24._0_8_ = uVar115;
      auVar24._12_3_ = auVar18._12_3_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = uVar115;
      auVar30[10] = (char)((uint)uVar3 >> 8);
      auVar30._11_4_ = auVar24._11_4_;
      auVar36._8_2_ = 0;
      auVar36._0_8_ = uVar115;
      auVar36._10_5_ = auVar30._10_5_;
      auVar42[8] = (char)uVar3;
      auVar42._0_8_ = uVar115;
      auVar42._9_6_ = auVar36._9_6_;
      auVar98._7_8_ = 0;
      auVar98._0_7_ = auVar42._8_7_;
      Var89 = CONCAT81(SUB158(auVar98 << 0x40,7),(char)((uint)uVar4 >> 0x18));
      auVar108._9_6_ = 0;
      auVar108._0_9_ = Var89;
      auVar46[4] = (char)((uint)uVar4 >> 0x10);
      auVar46._0_4_ = uVar4;
      auVar46._5_10_ = SUB1510(auVar108 << 0x30,5);
      auVar99._11_4_ = 0;
      auVar99._0_11_ = auVar46._4_11_;
      auVar52[2] = (char)((uint)uVar4 >> 8);
      auVar52._0_2_ = (ushort)uVar4;
      auVar52._3_12_ = SUB1512(auVar99 << 0x20,3);
      auVar131 = pshuflw(auVar137,ZEXT416(uVar122),0);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      auVar139._0_4_ =
           CONCAT22(sVar156 * auVar52._2_2_ + sVar162 * auVar51._2_2_,
                    sVar165 * ((ushort)uVar4 & 0xff) + sVar161 * auVar137._0_2_);
      auVar130._0_8_ =
           CONCAT26(sVar156 * (short)Var89 + sVar162 * (short)Var86,
                    CONCAT24(sVar165 * auVar46._4_2_ + sVar161 * auVar45._4_2_,auVar139._0_4_));
      auVar130._8_2_ = sVar165 * auVar42._8_2_ + sVar161 * auVar41._8_2_;
      auVar130._10_2_ = sVar156 * auVar30._10_2_ + sVar162 * auVar29._10_2_;
      auVar138._12_2_ = sVar165 * auVar18._12_2_ + sVar161 * auVar17._12_2_;
      auVar138._0_12_ = auVar130;
      auVar138._14_2_ = sVar156 * (auVar12._13_2_ >> 8) + sVar162 * (auVar11._13_2_ >> 8);
      uVar157 = CONCAT22((short)uVar116,(short)(0x100 - uVar116));
      auVar147._4_4_ = uVar157;
      auVar147._0_4_ = uVar157;
      auVar147._8_4_ = uVar157;
      auVar147._12_4_ = uVar157;
      auVar139._12_4_ = auVar138._12_4_;
      auVar139._4_4_ = auVar130._8_4_;
      auVar139._8_4_ = (int)((ulong)auVar130._0_8_ >> 0x20);
      auVar131 = pshuflw(auVar139,auVar139,0xd8);
      auVar131 = pshufhw(auVar131,auVar131,0xd8);
      auVar140._0_2_ = auVar131._0_2_ >> 8;
      auVar140._2_2_ = auVar131._2_2_ >> 8;
      auVar140._4_2_ = auVar131._4_2_ >> 8;
      auVar140._6_2_ = auVar131._6_2_ >> 8;
      auVar140._8_2_ = auVar131._8_2_ >> 8;
      auVar140._10_2_ = auVar131._10_2_ >> 8;
      auVar140._12_2_ = auVar131._12_2_ >> 8;
      auVar140._14_2_ = auVar131._14_2_ >> 8;
      auVar131 = pmaddwd(auVar140,auVar147);
      auVar141._0_4_ = auVar131._0_4_ >> 8;
      auVar141._4_4_ = auVar131._4_4_ >> 8;
      auVar141._8_4_ = auVar131._8_4_ >> 8;
      auVar141._12_4_ = auVar131._12_4_ >> 8;
      auVar131 = packssdw(auVar141,auVar141);
      sVar165 = auVar131._0_2_;
      sVar156 = auVar131._2_2_;
      sVar161 = auVar131._4_2_;
      sVar162 = auVar131._6_2_;
      *b = CONCAT13((0 < sVar162) * (sVar162 < 0x100) * auVar131[6] - (0xff < sVar162),
                    CONCAT12((0 < sVar161) * (sVar161 < 0x100) * auVar131[4] - (0xff < sVar161),
                             CONCAT11((0 < sVar156) * (sVar156 < 0x100) * auVar131[2] -
                                      (0xff < sVar156),
                                      (0 < sVar165) * (sVar165 < 0x100) * auVar131[0] -
                                      (0xff < sVar165))));
      *fx = *fx + fdx;
      uVar122 = *fy + fdy;
      *fy = uVar122;
      b = b + 1;
    } while (b < end);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_fast_rotate_helper(uint *b, uint *end, const QTextureData &image,
                                                                            int &fx, int &fy, int fdx, int fdy)
{
    //we are zooming less than 8x, use 4bit precision
    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        const qint64 min_fy = qint64(image.y1) * fixed_scale;
        const qint64 max_fy = qint64(image.y2 - 1) * fixed_scale;
        // first handle the possibly bounded part in the beginning
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            int y1 = (fy >> 16);
            int y2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
            if (x1 != x2 && y1 != y2)
                break;
            const uint *s1 = (const uint *)image.scanLine(y1);
            const uint *s2 = (const uint *)image.scanLine(y2);
            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];
            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
            }
            fx += fdx;
            fy += fdy;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        if (fdy > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fy - fy) / fdy);
        else if (fdy < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fy - fy) / fdy);

        // until boundedEnd we can now have a fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fdy = _mm_set1_epi32(fdy*4);
        const __m128i v_fxy_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);
        __m128i v_fy = _mm_setr_epi32(fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i vbpl = _mm_shufflelo_epi16(_mm_cvtsi32_si128(bytesPerLine/4), _MM_SHUFFLE(0, 0, 0, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = _mm_packs_epi32(_mm_srli_epi32(v_fy, 16), _mm_setzero_si128());
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = _mm_unpacklo_epi16(_mm_mullo_epi16(vy, vbpl), _mm_mulhi_epi16(vy, vbpl));
            offset = _mm_add_epi32(offset, _mm_srli_epi32(v_fx, 16));
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = _mm_setr_epi32(topData[offset0], topData[offset1], topData[offset2], topData[offset3]);
            const __m128i tr = _mm_setr_epi32(topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]);
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = _mm_setr_epi32(bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]);
            const __m128i br = _mm_setr_epi32(bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            __m128i v_disty = _mm_srli_epi16(v_fy, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fxy_r), 4);
            v_disty = _mm_srli_epi16(_mm_add_epi32(v_disty, v_fxy_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflehi_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));
            v_disty = _mm_shufflelo_epi16(v_disty, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
            v_fy = _mm_add_epi32(v_fy, v_fdy);
        }
        fx = _mm_cvtsi128_si32(v_fx);
        fy = _mm_cvtsi128_si32(v_fy);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        int32x4_t v_fdx = vdupq_n_s32(fdx * 4);
        int32x4_t v_fdy = vdupq_n_s32(fdy * 4);

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;

        int32x4_t v_fx = vmovq_n_s32(fx);
        int32x4_t v_fy = vmovq_n_s32(fy);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fy = vsetq_lane_s32(fy + fdy, v_fy, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fy = vsetq_lane_s32(fy + fdy * 2, v_fy, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);
        v_fy = vsetq_lane_s32(fy + fdy * 3, v_fy, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_round = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            int y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            const uchar *sl = textureData + bytesPerLine * y1;
            const uint *s1 = reinterpret_cast<const uint *>(sl);
            const uint *s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            y1 = (fy >> 16);
            fx += fdx; fy += fdy;
            sl = textureData + bytesPerLine * y1;
            s1 = reinterpret_cast<const uint *>(sl);
            s2 = reinterpret_cast<const uint *>(sl + bytesPerLine);
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_round), 12);
            int32x4_t v_disty = vshrq_n_s32(vaddq_s32(vandq_s32(v_fy, v_ffff_mask), v_round), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));
            v_disty = vorrq_s32(v_disty, vshlq_n_s32(v_disty, 16));
            int16x8_t v_disty_ = vshlq_n_s16(vreinterpretq_s16_s32(v_disty), 4);

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                        vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                        vreinterpretq_s16_s32(v_distx), vreinterpretq_s16_s32(v_disty),
                        v_disty_, colorMask, invColorMask, v_256, b);
            b += 4;
            v_fx = vaddq_s32(v_fx, v_fdx);
            v_fy = vaddq_s32(v_fy, v_fdy);
        }
#elif defined(__loongarch_sx)
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fdy = __lsx_vreplgr2vr_w(fdy*4);
        const __m128i v_fxy_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};
        __m128i v_fy = (__m128i)(v4i32){fy, fy + fdy, fy + fdy + fdy, fy + fdy + fdy + fdy};

        const uchar *textureData = image.imageData;
        const qsizetype bytesPerLine = image.bytesPerLine;
        const __m128i zero = __lsx_vldi(0);
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 0, 0, 4, 5, 6, 7};
        const __m128i shuffleMask1 = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i vbpl = __lsx_vshuf_h(shuffleMask, zero, __lsx_vinsgr2vr_w(zero, bytesPerLine/4, 0));

        while (b < boundedEnd - 3) {
            const __m128i vy = __lsx_vpickev_h(zero, __lsx_vsat_w(__lsx_vsrli_w(v_fy, 16), 15));
            // 4x16bit * 4x16bit -> 4x32bit
            __m128i offset = __lsx_vilvl_h(__lsx_vmuh_h(vy, vbpl), __lsx_vmul_h(vy, vbpl));
            offset = __lsx_vadd_w(offset, __lsx_vsrli_w(v_fx, 16));
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const uint *topData = (const uint *)(textureData);
            const __m128i tl = (__m128i)(v4u32){topData[offset0], topData[offset1], topData[offset2], topData[offset3]};
            const __m128i tr = (__m128i)(v4u32){topData[offset0 + 1], topData[offset1 + 1], topData[offset2 + 1], topData[offset3 + 1]};
            const uint *bottomData = (const uint *)(textureData + bytesPerLine);
            const __m128i bl = (__m128i)(v4u32){bottomData[offset0], bottomData[offset1], bottomData[offset2], bottomData[offset3]};
            const __m128i br = (__m128i)(v4u32){bottomData[offset0 + 1], bottomData[offset1 + 1], bottomData[offset2 + 1], bottomData[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            __m128i v_disty = __lsx_vsrli_h(v_fy, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fxy_r), 4);
            v_disty = __lsx_vsrli_h(__lsx_vadd_w(v_disty, v_fxy_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask1, zero, v_distx);
            v_disty = __lsx_vshuf_h(shuffleMask1, zero, v_disty);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
            v_fy = __lsx_vadd_w(v_fy, v_fdy);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
        fy = __lsx_vpickve2gr_w(v_fy, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            int y = (fy >> 16);

            const uint *s1 = (const uint *)image.scanLine(y);
            const uint *s2 = (const uint *)image.scanLine(y + 1);

            if (hasFastInterpolate4()) {
                int distx = (fx & 0x0000ffff) >> 8;
                int disty = (fy & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx, disty);
            } else {
                int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx, disty);
            }

            fx += fdx;
            fy += fdy;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        int y1 = (fy >> 16);
        int y2;

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uint *s1 = (const uint *)image.scanLine(y1);
        const uint *s2 = (const uint *)image.scanLine(y2);

        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];

        if (hasFastInterpolate4()) {
            int distx = (fx & 0x0000ffff) >> 8;
            int disty = (fy & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);
        } else {
            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
            int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
        }

        fx += fdx;
        fy += fdy;
        ++b;
    }
}